

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

void __thiscall network_pimpl::insert_event(network_pimpl *this,EventDataType *value)

{
  EventDataType *pEVar1;
  __type _Var2;
  ostream *poVar3;
  EventDataType *this_00;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = (this->events).super__Vector_base<EventDataType,_std::allocator<EventDataType>_>._M_impl
            .super__Vector_impl_data._M_start;
  pEVar1 = (this->events).super__Vector_base<EventDataType,_std::allocator<EventDataType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (this_00 == pEVar1) {
      std::vector<EventDataType,_std::allocator<EventDataType>_>::push_back(&this->events,value);
      return;
    }
    EventDataType::getName_abi_cxx11_(&local_b0,this_00);
    EventDataType::getName_abi_cxx11_(&local_90,value);
    _Var2 = std::operator==(&local_b0,&local_90);
    if (_Var2) {
      EventDataType::getOrigin_abi_cxx11_(&local_70,this_00);
      EventDataType::getOrigin_abi_cxx11_(&local_50,value);
      _Var2 = std::operator==(&local_70,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      if (_Var2) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"---duplicate event ");
        EventDataType::getName_abi_cxx11_(&local_b0,this_00);
        poVar3 = std::operator<<(poVar3,(string *)&local_b0);
        std::operator<<(poVar3,"\n");
        std::__cxx11::string::~string((string *)&local_b0);
        return;
      }
    }
    else {
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

void network_pimpl::insert_event(const EventDataType &value){
    for(auto const& ev : events){
        if(ev.getName() == value.getName() && ev.getOrigin() == value.getOrigin()){
            std::cerr << "---duplicate event " << ev.getName() << "\n";
            return;
        }
    }
    events.push_back(value);
}